

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O1

void ModifyDropAmount(AInventory *inv,int dropamount)

{
  byte *pbVar1;
  double dVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  PClass *pPVar6;
  int iVar7;
  PClass *pPVar8;
  bool bVar9;
  double dVar10;
  
  dVar2 = G_SkillProperty(SKILLP_DropAmmoFactor);
  pPVar6 = AAmmo::RegistrationInfo.MyClass;
  dVar10 = (double)(~-(ulong)(dVar2 == -1.0) & (ulong)dVar2 |
                   -(ulong)(dVar2 == -1.0) & 0x3fe0000000000000);
  if (dropamount < 1) {
    if ((inv->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
      iVar4 = (**(inv->super_AActor).super_DThinker.super_DObject._vptr_DObject)(inv);
      (inv->super_AActor).super_DThinker.super_DObject.Class =
           (PClass *)CONCAT44(extraout_var_00,iVar4);
    }
    pPVar3 = AWeaponGiver::RegistrationInfo.MyClass;
    pPVar5 = (inv->super_AActor).super_DThinker.super_DObject.Class;
    bVar9 = pPVar5 != (PClass *)0x0;
    pPVar8 = pPVar5;
    if (pPVar5 != pPVar6 && bVar9) {
      do {
        pPVar8 = pPVar8->ParentClass;
        bVar9 = pPVar8 != (PClass *)0x0;
        if (pPVar8 == pPVar6) break;
      } while (pPVar8 != (PClass *)0x0);
    }
    if (bVar9) {
      if (pPVar5 == (PClass *)0x0) {
        iVar4 = (**(inv->super_AActor).super_DThinker.super_DObject._vptr_DObject)(inv);
        (inv->super_AActor).super_DThinker.super_DObject.Class =
             (PClass *)CONCAT44(extraout_var_01,iVar4);
      }
      iVar4 = *(int *)&(inv->super_AActor).super_DThinker.super_DObject.Class[2].super_PNativeStruct
                       .super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
                       super_PTypeBase.super_DObject;
      if (iVar4 < 1) {
        iVar7 = (int)(dVar10 * (double)inv->Amount);
        iVar4 = 1;
        if (1 < iVar7) {
          iVar4 = iVar7;
        }
      }
      inv->Amount = iVar4;
    }
    else {
      if (pPVar5 == (PClass *)0x0) {
        iVar4 = (**(inv->super_AActor).super_DThinker.super_DObject._vptr_DObject)(inv);
        (inv->super_AActor).super_DThinker.super_DObject.Class =
             (PClass *)CONCAT44(extraout_var_02,iVar4);
      }
      pPVar8 = AWeapon::RegistrationInfo.MyClass;
      pPVar6 = (inv->super_AActor).super_DThinker.super_DObject.Class;
      bVar9 = pPVar6 != (PClass *)0x0;
      pPVar5 = pPVar6;
      if (pPVar6 != pPVar3 && bVar9) {
        do {
          pPVar5 = pPVar5->ParentClass;
          bVar9 = pPVar5 != (PClass *)0x0;
          if (pPVar5 == pPVar3) break;
        } while (pPVar5 != (PClass *)0x0);
      }
      if (bVar9) {
        inv[1].super_AActor.Angles.Pitch.Degrees = dVar10;
      }
      else {
        if (pPVar6 == (PClass *)0x0) {
          iVar4 = (**(inv->super_AActor).super_DThinker.super_DObject._vptr_DObject)(inv);
          (inv->super_AActor).super_DThinker.super_DObject.Class =
               (PClass *)CONCAT44(extraout_var_03,iVar4);
        }
        pPVar3 = ADehackedPickup::RegistrationInfo.MyClass;
        pPVar6 = (inv->super_AActor).super_DThinker.super_DObject.Class;
        bVar9 = pPVar6 != (PClass *)0x0;
        pPVar5 = pPVar6;
        if (pPVar6 != pPVar8 && bVar9) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar9 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar8) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar9) {
          if (pPVar6 == (PClass *)0x0) {
            iVar4 = (**(inv->super_AActor).super_DThinker.super_DObject._vptr_DObject)(inv);
            (inv->super_AActor).super_DThinker.super_DObject.Class =
                 (PClass *)CONCAT44(extraout_var_04,iVar4);
          }
          pPVar6 = (inv->super_AActor).super_DThinker.super_DObject.Class;
          bVar9 = pPVar6 != (PClass *)0x0;
          if (pPVar6 != pPVar3 && bVar9) {
            do {
              pPVar6 = pPVar6->ParentClass;
              bVar9 = pPVar6 != (PClass *)0x0;
              if (pPVar6 == pPVar3) break;
            } while (pPVar6 != (PClass *)0x0);
          }
          if (!bVar9) {
            return;
          }
          *(undefined1 *)&inv[1].super_AActor.super_DThinker.super_DObject.Class = 1;
          return;
        }
        *(int *)&inv[1].super_AActor.super_DThinker.super_DObject.ObjNext =
             (int)((double)*(int *)&inv[1].super_AActor.super_DThinker.super_DObject.ObjNext *
                  dVar10);
        *(int *)((long)&inv[1].super_AActor.super_DThinker.super_DObject.ObjNext + 4) =
             (int)((double)*(int *)((long)&inv[1].super_AActor.super_DThinker.super_DObject.ObjNext
                                   + 4) * dVar10);
      }
    }
    inv->ItemFlags = inv->ItemFlags | (-(uint)(dVar2 != -1.0) & 1) << 0xe;
  }
  else {
    if ((dVar2 != -1.0) || (NAN(dVar2))) {
      if ((inv->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(inv->super_AActor).super_DThinker.super_DObject._vptr_DObject)(inv);
        (inv->super_AActor).super_DThinker.super_DObject.Class =
             (PClass *)CONCAT44(extraout_var,iVar4);
      }
      pPVar5 = (inv->super_AActor).super_DThinker.super_DObject.Class;
      bVar9 = pPVar5 != (PClass *)0x0;
      if (pPVar5 != pPVar6 && bVar9) {
        do {
          pPVar5 = pPVar5->ParentClass;
          bVar9 = pPVar5 != (PClass *)0x0;
          if (pPVar5 == pPVar6) break;
        } while (pPVar5 != (PClass *)0x0);
      }
      if (bVar9) {
        inv->Amount = (int)(dVar10 * (double)dropamount);
        pbVar1 = (byte *)((long)&inv->ItemFlags + 1);
        *pbVar1 = *pbVar1 | 0x40;
        return;
      }
    }
    inv->Amount = dropamount;
  }
  return;
}

Assistant:

void ModifyDropAmount(AInventory *inv, int dropamount)
{
	int flagmask = IF_IGNORESKILL;
	double dropammofactor = G_SkillProperty(SKILLP_DropAmmoFactor);
	// Default drop amount is half of regular amount * regular ammo multiplication
	if (dropammofactor == -1) 
	{
		dropammofactor = 0.5;
		flagmask = 0;
	}

	if (dropamount > 0)
	{
		if (flagmask != 0 && inv->IsKindOf(RUNTIME_CLASS(AAmmo)))
		{
			inv->Amount = int(dropamount * dropammofactor);
			inv->ItemFlags |= IF_IGNORESKILL;
		}
		else
		{
			inv->Amount = dropamount;
		}
	}
	else if (inv->IsKindOf (RUNTIME_CLASS(AAmmo)))
	{
		// Half ammo when dropped by bad guys.
		int amount = static_cast<PClassAmmo *>(inv->GetClass())->DropAmount;
		if (amount <= 0)
		{
			amount = MAX(1, int(inv->Amount * dropammofactor));
		}
		inv->Amount = amount;
		inv->ItemFlags |= flagmask;
	}
	else if (inv->IsKindOf (RUNTIME_CLASS(AWeaponGiver)))
	{
		static_cast<AWeaponGiver *>(inv)->DropAmmoFactor = dropammofactor;
		inv->ItemFlags |= flagmask;
	}
	else if (inv->IsKindOf (RUNTIME_CLASS(AWeapon)))
	{
		// The same goes for ammo from a weapon.
		static_cast<AWeapon *>(inv)->AmmoGive1 = int(static_cast<AWeapon *>(inv)->AmmoGive1 * dropammofactor);
		static_cast<AWeapon *>(inv)->AmmoGive2 = int(static_cast<AWeapon *>(inv)->AmmoGive2 * dropammofactor);
		inv->ItemFlags |= flagmask;
	}			
	else if (inv->IsKindOf (RUNTIME_CLASS(ADehackedPickup)))
	{
		// For weapons and ammo modified by Dehacked we need to flag the item.
		static_cast<ADehackedPickup *>(inv)->droppedbymonster = true;
	}
}